

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMI_RH_HIERARCHY_Unmarshal(TPMI_RH_HIERARCHY *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  int iVar1;
  TPMI_RH_HIERARCHY TVar2;
  UINT32 UVar3;
  TPM_RC TVar4;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar4 = 0x9a;
  if (3 < iVar1) {
    UVar3 = ByteArrayToUint32(*buffer);
    *target = UVar3;
    *buffer = *buffer + 4;
    TVar2 = *target;
    if (((TVar2 + 0xbffffff5 < 2) || (TVar2 == 0x40000001)) ||
       ((TVar4 = 0x84, TVar2 == 0x40000007 && (flag != 0)))) {
      TVar4 = 0;
    }
  }
  return TVar4;
}

Assistant:

TPM_RC
TPMI_RH_HIERARCHY_Unmarshal(TPMI_RH_HIERARCHY *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_OWNER:
        case TPM_RH_PLATFORM:
        case TPM_RH_ENDORSEMENT:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}